

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PendingListAppend
              (PendingList **pp,sqlite3_int64 iDocid,sqlite3_int64 iCol,sqlite3_int64 iPos,int *pRc)

{
  PendingList *pPVar1;
  long local_60;
  sqlite3_int64 iDelta;
  PendingList *pPStack_40;
  int rc;
  PendingList *p;
  int *pRc_local;
  sqlite3_int64 iPos_local;
  sqlite3_int64 iCol_local;
  sqlite3_int64 iDocid_local;
  PendingList **pp_local;
  
  pPStack_40 = *pp;
  iDelta._4_4_ = 0;
  p = (PendingList *)pRc;
  pRc_local = (int *)iPos;
  iPos_local = iCol;
  iCol_local = iDocid;
  iDocid_local = (sqlite3_int64)pp;
  if ((pPStack_40 == (PendingList *)0x0) || (pPStack_40->iLastDocid != iDocid)) {
    if (pPStack_40 == (PendingList *)0x0) {
      local_60 = 0;
    }
    else {
      local_60 = pPStack_40->iLastDocid;
    }
    if (pPStack_40 != (PendingList *)0x0) {
      pPStack_40->nData = pPStack_40->nData + 1;
    }
    iDelta._4_4_ = fts3PendingListAppendVarint(&stack0xffffffffffffffc0,iDocid - local_60);
    if (iDelta._4_4_ != 0) goto LAB_00203637;
    pPStack_40->iLastCol = -1;
    pPStack_40->iLastPos = 0;
    pPStack_40->iLastDocid = iCol_local;
  }
  if ((0 < iPos_local) && (pPStack_40->iLastCol != iPos_local)) {
    iDelta._4_4_ = fts3PendingListAppendVarint(&stack0xffffffffffffffc0,1);
    if ((iDelta._4_4_ != 0) ||
       (iDelta._4_4_ = fts3PendingListAppendVarint(&stack0xffffffffffffffc0,iPos_local),
       iDelta._4_4_ != 0)) goto LAB_00203637;
    pPStack_40->iLastCol = iPos_local;
    pPStack_40->iLastPos = 0;
  }
  if ((-1 < iPos_local) &&
     (iDelta._4_4_ = fts3PendingListAppendVarint
                               (&stack0xffffffffffffffc0,
                                (long)pRc_local + (2 - pPStack_40->iLastPos)), iDelta._4_4_ == 0)) {
    pPStack_40->iLastPos = (sqlite3_int64)pRc_local;
  }
LAB_00203637:
  p->nData = iDelta._4_4_;
  pPVar1 = *(PendingList **)iDocid_local;
  if (pPStack_40 != pPVar1) {
    *(PendingList **)iDocid_local = pPStack_40;
  }
  pp_local._4_4_ = (uint)(pPStack_40 != pPVar1);
  return pp_local._4_4_;
}

Assistant:

static int fts3PendingListAppend(
  PendingList **pp,               /* IN/OUT: PendingList structure */
  sqlite3_int64 iDocid,           /* Docid for entry to add */
  sqlite3_int64 iCol,             /* Column for entry to add */
  sqlite3_int64 iPos,             /* Position of term for entry to add */
  int *pRc                        /* OUT: Return code */
){
  PendingList *p = *pp;
  int rc = SQLITE_OK;

  assert( !p || p->iLastDocid<=iDocid );

  if( !p || p->iLastDocid!=iDocid ){
    sqlite3_int64 iDelta = iDocid - (p ? p->iLastDocid : 0);
    if( p ){
      assert( p->nData<p->nSpace );
      assert( p->aData[p->nData]==0 );
      p->nData++;
    }
    if( SQLITE_OK!=(rc = fts3PendingListAppendVarint(&p, iDelta)) ){
      goto pendinglistappend_out;
    }
    p->iLastCol = -1;
    p->iLastPos = 0;
    p->iLastDocid = iDocid;
  }
  if( iCol>0 && p->iLastCol!=iCol ){
    if( SQLITE_OK!=(rc = fts3PendingListAppendVarint(&p, 1))
     || SQLITE_OK!=(rc = fts3PendingListAppendVarint(&p, iCol))
    ){
      goto pendinglistappend_out;
    }
    p->iLastCol = iCol;
    p->iLastPos = 0;
  }
  if( iCol>=0 ){
    assert( iPos>p->iLastPos || (iPos==0 && p->iLastPos==0) );
    rc = fts3PendingListAppendVarint(&p, 2+iPos-p->iLastPos);
    if( rc==SQLITE_OK ){
      p->iLastPos = iPos;
    }
  }

 pendinglistappend_out:
  *pRc = rc;
  if( p!=*pp ){
    *pp = p;
    return 1;
  }
  return 0;
}